

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::maxSI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  Literal *val;
  long lVar1;
  Literal *this_00;
  undefined1 local_340 [8];
  LaneArray<16> other_lanes;
  LaneArray<16> lanes;
  
  getLanes<signed_char,16>((LaneArray<16> *)&other_lanes._M_elems[0xf].type,(wasm *)this,other);
  getLanes<signed_char,16>((LaneArray<16> *)local_340,(wasm *)other,val);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
  do {
    this_00 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
    maxInt((Literal *)__return_storage_ptr___00,this_00,(Literal *)(local_340 + lVar1));
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x180);
  Literal(__return_storage_ptr__,(LaneArray<16> *)&other_lanes._M_elems[0xf].type);
  lVar1 = 0x168;
  do {
    ~Literal((Literal *)(local_340 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x168;
  do {
    ~Literal((Literal *)((long)lanes._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::maxSI8x16(const Literal& other) const {
  return binary<16, &Literal::getLanesSI8x16, &Literal::maxInt>(*this, other);
}